

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_connect(Curl_easy *data,connectdata **in_connect,_Bool *asyncp,_Bool *protocol_done)

{
  curl_proxytype cVar1;
  uint uVar2;
  void *pvVar3;
  hostname *first;
  _Bool _Var4;
  byte bVar5;
  char cVar6;
  int iVar7;
  CURLcode CVar8;
  CURLcode CVar9;
  size_t sVar10;
  size_t sVar11;
  connectdata *pcVar12;
  ssl_backend_data *psVar13;
  char *pcVar14;
  size_t sVar15;
  char *pcVar16;
  long lVar17;
  undefined8 uVar18;
  char *pcVar19;
  size_t sVar20;
  byte *pbVar21;
  ulong uVar22;
  byte *pbVar23;
  connectbundle *bundle;
  connectdata *pcVar24;
  Curl_handler *pCVar25;
  char *pcVar26;
  Curl_handler **ppCVar27;
  byte *__s;
  bool bVar28;
  curltime cVar29;
  _Bool waitpipe;
  _Bool force_reuse;
  char *options;
  char *passwd;
  char *user;
  connectdata *conn_temp;
  char slashbuf [4];
  char protobuf [16];
  _Bool local_9e;
  _Bool local_9d;
  uint local_9c;
  hostname *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  size_t local_78;
  size_t local_70;
  _Bool *local_68;
  connectdata *local_60;
  char *local_58;
  size_t local_50;
  _Bool local_48 [24];
  
  *asyncp = false;
  local_60 = (connectdata *)0x0;
  local_80 = (char *)0x0;
  local_88 = (char *)0x0;
  local_90 = (char *)0x0;
  local_9d = false;
  local_9e = false;
  sVar10 = Curl_multi_max_host_connections(data->multi);
  sVar11 = Curl_multi_max_total_connections(data->multi);
  *asyncp = false;
  local_68 = asyncp;
  if ((data->change).url == (char *)0x0) {
LAB_0011a27f:
    CVar8 = CURLE_URL_MALFORMAT;
    goto LAB_0011afeb;
  }
  local_78 = sVar10;
  local_70 = sVar11;
  pcVar12 = (connectdata *)(*Curl_ccalloc)(1,0x758);
  CVar8 = CURLE_OUT_OF_MEMORY;
  if (pcVar12 == (connectdata *)0x0) goto LAB_0011afeb;
  sVar10 = Curl_ssl->sizeof_ssl_backend_data;
  psVar13 = (ssl_backend_data *)(*Curl_ccalloc)(4,sVar10);
  if (psVar13 == (ssl_backend_data *)0x0) {
    (*Curl_cfree)(pcVar12);
    goto LAB_0011afeb;
  }
  pcVar12->ssl_extra = psVar13;
  pcVar12->ssl[0].backend = psVar13;
  pcVar12->ssl[1].backend = (ssl_backend_data *)((psVar13->tap_state).master_key + (sVar10 - 0x1c));
  pcVar12->proxy_ssl[0].backend =
       (ssl_backend_data *)((psVar13->tap_state).master_key + sVar10 * 2 + -0x1c);
  pcVar12->proxy_ssl[1].backend =
       (ssl_backend_data *)((psVar13->tap_state).master_key + sVar10 * 3 + -0x1c);
  pcVar12->handler = &Curl_handler_dummy;
  pcVar12->connection_id = -1;
  pcVar12->port = -1;
  pcVar12->remote_port = -1;
  pcVar12->sock[0] = -1;
  pcVar12->sock[1] = -1;
  pcVar12->tempsock[0] = -1;
  pcVar12->tempsock[1] = -1;
  Curl_conncontrol(pcVar12,1);
  cVar29 = Curl_now();
  (pcVar12->created).tv_sec = cVar29.tv_sec;
  (pcVar12->created).tv_usec = cVar29.tv_usec;
  pcVar12->data = data;
  cVar1 = (data->set).proxytype;
  (pcVar12->http_proxy).proxytype = cVar1;
  (pcVar12->socks_proxy).proxytype = CURLPROXY_SOCKS4;
  pcVar14 = (data->set).str[0x15];
  if (pcVar14 == (char *)0x0) {
    (pcVar12->bits).proxy = false;
LAB_00119cc5:
    (pcVar12->bits).httpproxy = false;
    bVar28 = false;
  }
  else {
    bVar28 = *pcVar14 == '\0';
    (pcVar12->bits).proxy = !bVar28;
    if (bVar28) goto LAB_00119cc5;
    bVar28 = cVar1 >= (CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0);
    (pcVar12->bits).httpproxy = cVar1 < (CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0);
  }
  (pcVar12->bits).socksproxy = bVar28;
  pcVar14 = (data->set).str[0x16];
  if ((pcVar14 != (char *)0x0) && (*pcVar14 != '\0')) {
    (pcVar12->bits).proxy = true;
    (pcVar12->bits).socksproxy = true;
  }
  (pcVar12->bits).proxy_user_passwd = (data->set).str[0x2c] != (char *)0x0;
  (pcVar12->bits).tunnel_proxy = (data->set).tunnel_thru_httpproxy;
  (pcVar12->bits).user_passwd = (data->set).str[0x29] != (char *)0x0;
  (pcVar12->bits).ftp_use_epsv = (data->set).ftp_use_epsv;
  (pcVar12->bits).ftp_use_eprt = (data->set).ftp_use_eprt;
  (pcVar12->ssl_config).verifystatus = (data->set).ssl.primary.verifystatus;
  (pcVar12->ssl_config).verifypeer = (data->set).ssl.primary.verifypeer;
  (pcVar12->ssl_config).verifyhost = (data->set).ssl.primary.verifyhost;
  (pcVar12->proxy_ssl_config).verifystatus = (data->set).proxy_ssl.primary.verifystatus;
  (pcVar12->proxy_ssl_config).verifypeer = (data->set).proxy_ssl.primary.verifypeer;
  (pcVar12->proxy_ssl_config).verifyhost = (data->set).proxy_ssl.primary.verifyhost;
  pcVar12->ip_version = (data->set).ipver;
  _Var4 = Curl_pipeline_wanted(data->multi,1);
  if ((_Var4) && (pcVar12->master_buffer == (char *)0x0)) {
    pcVar14 = (char *)(*Curl_ccalloc)(0x4000,1);
    pcVar12->master_buffer = pcVar14;
    if (pcVar14 != (char *)0x0) goto LAB_00119ded;
LAB_00119f81:
    Curl_llist_destroy(&pcVar12->send_pipe,(void *)0x0);
    Curl_llist_destroy(&pcVar12->recv_pipe,(void *)0x0);
    (*Curl_cfree)(pcVar12->master_buffer);
    (*Curl_cfree)(pcVar12->localdev);
    (*Curl_cfree)(pcVar12->ssl_extra);
    (*Curl_cfree)(pcVar12);
    goto LAB_0011afeb;
  }
LAB_00119ded:
  Curl_llist_init(&pcVar12->send_pipe,llist_dtor);
  Curl_llist_init(&pcVar12->recv_pipe,llist_dtor);
  pcVar14 = (data->set).str[8];
  if (pcVar14 != (char *)0x0) {
    pcVar14 = (*Curl_cstrdup)(pcVar14);
    pcVar12->localdev = pcVar14;
    if (pcVar14 == (char *)0x0) goto LAB_00119f81;
  }
  pcVar12->localportrange = (data->set).localportrange;
  pcVar12->localport = (data->set).localport;
  pvVar3 = (data->set).closesocket_client;
  pcVar12->fclosesocket = (data->set).fclosesocket;
  pcVar12->closesocket_client = pvVar3;
  *in_connect = pcVar12;
  sVar15 = strlen((data->change).url);
  sVar20 = 0x100;
  if (0x100 < sVar15) {
    sVar20 = sVar15;
  }
  (*Curl_cfree)((data->state).pathbuffer);
  (data->state).pathbuffer = (char *)0x0;
  (data->state).path = (char *)0x0;
  pcVar14 = (char *)(*Curl_cmalloc)(sVar20 + 2);
  (data->state).pathbuffer = pcVar14;
  if (pcVar14 != (char *)0x0) {
    (data->state).path = pcVar14;
    pcVar14 = (char *)(*Curl_cmalloc)(sVar20 + 2);
    (pcVar12->host).rawalloc = pcVar14;
    if (pcVar14 == (char *)0x0) {
      (*Curl_cfree)((data->state).pathbuffer);
      (data->state).pathbuffer = (char *)0x0;
      (data->state).path = (char *)0x0;
    }
    else {
      (pcVar12->host).name = pcVar14;
      *pcVar14 = '\0';
      pcVar14 = (*Curl_cstrdup)("");
      local_80 = pcVar14;
      pcVar16 = (*Curl_cstrdup)("");
      local_88 = pcVar16;
      local_90 = (*Curl_cstrdup)("");
      if (local_90 != (char *)0x0 && (pcVar16 != (char *)0x0 && pcVar14 != (char *)0x0)) {
        pbVar23 = (byte *)(data->state).path;
        pbVar21 = (byte *)(data->change).url;
        pcVar14 = strpbrk((char *)pbVar21,"\r\n");
        if (pcVar14 == (char *)0x0) {
          if (*pbVar21 != 0x3a) {
            if ((((byte)((*pbVar21 & 0xdf) + 0xbf) < 0x1a) && (pbVar21[1] == 0x3a)) &&
               (pcVar14 = (data->set).str[7], pcVar14 != (char *)0x0)) {
              iVar7 = Curl_strcasecompare(pcVar14,"file");
              if (iVar7 == 0) {
                pbVar21 = (byte *)(data->change).url;
                goto LAB_0011a036;
              }
            }
            else {
LAB_0011a036:
              lVar17 = 0;
              do {
                bVar5 = pbVar21[lVar17];
                uVar18 = 0;
                if ((bVar5 == 0) || (bVar5 == 0x2f)) break;
                if (bVar5 == 0x3a) {
                  iVar7 = Curl_strncasecompare((char *)pbVar21,"file:",5);
                  if (iVar7 == 0) goto LAB_0011a1b4;
                  iVar7 = __isoc99_sscanf((data->change).url,"%*15[^\n/:]:%[^\n]",pbVar23);
                  if (iVar7 != 1) goto LAB_0011a26e;
                  bVar5 = *pbVar23;
                  local_9c = (uint)CONCAT71((int7)((ulong)uVar18 >> 8),1);
                  if (bVar5 != 0x2f) goto LAB_0011a320;
                  local_9c = (uint)CONCAT71((int7)((ulong)pbVar23 >> 8),1);
                  if (pbVar23[1] != 0x2f) goto LAB_0011a0ae;
                  pbVar21 = pbVar23 + 2;
                  if (pbVar23[2] == 0x2f) {
                    if (pbVar23[3] == 0x2f) {
                      pcVar14 = "SMB shares are not supported in file: URLs.";
LAB_0011a1a0:
                      Curl_failf(data,pcVar14);
                      CVar8 = CURLE_URL_MALFORMAT;
                      goto LAB_0011afeb;
                    }
                  }
                  else if (((0x19 < (byte)((pbVar23[2] & 0xdf) + 0xbf)) ||
                           ((pbVar23[3] != 0x7c && (pbVar23[3] != 0x3a)))) ||
                          ((bVar5 = pbVar23[4], bVar5 != 0 && ((bVar5 != 0x2f && (bVar5 != 0x5c)))))
                          ) {
                    iVar7 = curl_strnequal("localhost/",(char *)pbVar21,10);
                    if ((iVar7 == 0) &&
                       (iVar7 = curl_strnequal("127.0.0.1/",(char *)pbVar21,10), iVar7 == 0)) {
                      pcVar14 = "Invalid file://hostname/, expected localhost or 127.0.0.1 or none";
                      goto LAB_0011a1a0;
                    }
                    pbVar21 = pbVar23 + 0xb;
                  }
                  __s = pbVar21 + 1;
                  if (pbVar21[1] != 0x2f) {
                    __s = pbVar21;
                  }
                  sVar20 = strlen((char *)__s);
                  memmove(pbVar23,__s,sVar20 + 1);
                  goto LAB_0011a0ae;
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 != 0x10);
            }
            pcVar14 = (data->set).str[7];
            if ((pcVar14 != (char *)0x0) &&
               (iVar7 = Curl_strcasecompare(pcVar14,"file"), iVar7 != 0)) {
              local_9c = 0;
              iVar7 = __isoc99_sscanf((data->change).url,"%[^\n]",pbVar23);
              if (iVar7 != 1) {
LAB_0011a26e:
                pcVar14 = "Bad URL";
LAB_0011a275:
                Curl_failf(data,pcVar14);
                goto LAB_0011a27f;
              }
LAB_0011a0ae:
              bVar5 = *pbVar23;
              if (bVar5 == 0x2f) {
                if ((((byte)((pbVar23[1] & 0xdf) + 0xbf) < 0x1a) &&
                    ((pbVar23[2] == 0x7c || (pbVar23[2] == 0x3a)))) &&
                   ((bVar5 = pbVar23[3], bVar5 == 0 || ((bVar5 == 0x2f || (bVar5 == 0x5c)))))) {
LAB_0011a352:
                  pcVar14 = "File drive letters are only accepted in MSDOS/Windows.";
                  goto LAB_0011a275;
                }
              }
              else {
LAB_0011a320:
                if ((((byte)((bVar5 & 0xdf) + 0xbf) < 0x1a) &&
                    ((pbVar23[1] == 0x7c || (pbVar23[1] == 0x3a)))) &&
                   ((bVar5 = pbVar23[2], bVar5 == 0 || ((bVar5 == 0x5c || (bVar5 == 0x2f))))))
                goto LAB_0011a352;
              }
              local_9c = local_9c ^ 1;
              pcVar14 = "file";
              goto LAB_0011a36f;
            }
LAB_0011a1b4:
            *pbVar23 = 0;
            pcVar14 = local_48;
            uVar18 = __isoc99_sscanf((data->change).url,"%15[^\n/:]:%3[/]%[^\n/?#]%[^\n]",pcVar14,
                                     &local_58,(pcVar12->host).name,pbVar23);
            iVar7 = (int)uVar18;
            if (iVar7 == 2) {
              pcVar14 = "Bad URL";
              goto LAB_0011a68e;
            }
            local_9c = (uint)CONCAT71((int7)((ulong)uVar18 >> 8),iVar7 < 3);
            if (iVar7 < 3) {
              iVar7 = __isoc99_sscanf((data->change).url,"%[^\n/?#]%[^\n]",(pcVar12->host).name,
                                      pbVar23);
              if (0 < iVar7) {
                pcVar14 = (data->set).str[7];
                if ((hostname *)pcVar14 == (hostname *)0x0) {
                  iVar7 = curl_strnequal("FTP.",(pcVar12->host).name,4);
                  if (iVar7 == 0) {
                    iVar7 = curl_strnequal("DICT.",(pcVar12->host).name,5);
                    if (iVar7 == 0) {
                      iVar7 = curl_strnequal("LDAP.",(pcVar12->host).name,5);
                      if (iVar7 == 0) {
                        iVar7 = curl_strnequal("IMAP.",(pcVar12->host).name,5);
                        if (iVar7 == 0) {
                          iVar7 = curl_strnequal("SMTP.",(pcVar12->host).name,5);
                          if (iVar7 == 0) {
                            iVar7 = curl_strnequal("POP3.",(pcVar12->host).name,5);
                            pcVar14 = "pop3";
                            if (iVar7 == 0) {
                              pcVar14 = "http";
                            }
                          }
                          else {
                            pcVar14 = "smtp";
                          }
                        }
                        else {
                          pcVar14 = "IMAP";
                        }
                      }
                      else {
                        pcVar14 = "LDAP";
                      }
                    }
                    else {
                      pcVar14 = "DICT";
                    }
                  }
                  else {
                    pcVar14 = "ftp";
                  }
                }
                goto LAB_0011a36f;
              }
              goto LAB_0011a687;
            }
            sVar20 = strlen((char *)&local_58);
            if (sVar20 == 2) {
LAB_0011a36f:
              pcVar16 = (pcVar12->host).name;
              pcVar19 = strchr(pcVar16,0x40);
              pcVar26 = pcVar19 + 1;
              if (pcVar19 == (char *)0x0) {
                pcVar26 = pcVar16;
              }
              pcVar16 = strchr(pcVar26,0x3f);
              local_98 = (hostname *)CONCAT71(local_98._1_7_,pcVar16 != (char *)0x0);
              if (pcVar16 == (char *)0x0) {
                bVar5 = *pbVar23;
                if (bVar5 != 0) goto LAB_0011a409;
                pbVar23[0] = 0x2f;
                pbVar23[1] = 0;
                local_98 = (hostname *)CONCAT71(local_98._1_7_,1);
LAB_0011a451:
                if ((data->set).path_as_is == false) {
                  pbVar21 = (byte *)Curl_dedotdotify((char *)pbVar23);
                  if (pbVar21 == (byte *)0x0) {
                    CVar8 = CURLE_OUT_OF_MEMORY;
                    goto LAB_0011afeb;
                  }
                  iVar7 = strcmp((char *)pbVar21,(char *)pbVar23);
                  if (iVar7 != 0) {
                    (*Curl_cfree)((data->state).pathbuffer);
                    (data->state).pathbuffer = (char *)pbVar21;
                    (data->state).path = (char *)pbVar21;
                    goto LAB_0011a4d1;
                  }
                  (*Curl_cfree)(pbVar21);
                }
                pbVar21 = pbVar23;
                if ((char)local_98 == '\0') goto LAB_0011a648;
              }
              else {
                sVar20 = strlen(pcVar16);
                sVar15 = strlen((char *)pbVar23);
                memmove(pbVar23 + sVar20 + 1,pbVar23,sVar15 + 1);
                memcpy(pbVar23 + 1,pcVar16,sVar20);
                *pbVar23 = 0x2f;
                *pcVar16 = '\0';
                bVar5 = *pbVar23;
LAB_0011a409:
                if (bVar5 == 0x2f) goto LAB_0011a451;
                sVar20 = strlen((char *)pbVar23);
                memmove(pbVar23 + 1,pbVar23,sVar20 + 1);
                *pbVar23 = 0x2f;
                pbVar21 = pbVar23;
              }
LAB_0011a4d1:
              local_98 = (hostname *)pcVar14;
              sVar20 = strlen((char *)pbVar21);
              sVar15 = strlen((pcVar12->host).name);
              first = local_98;
              if ((char)local_9c == '\0') {
                local_50 = sVar15;
                sVar15 = strlen((char *)local_98);
                iVar7 = curl_strnequal((char *)first,(data->change).url,sVar15);
                if (iVar7 == 0) {
LAB_0011a687:
                  pcVar14 = "<url> malformed";
                  goto LAB_0011a68e;
                }
                lVar17 = local_50 + sVar15;
                iVar7 = curl_strnequal("://",(data->change).url + sVar15,3);
                if (iVar7 == 0) {
                  iVar7 = curl_strnequal("file:",(data->change).url,5);
                  if (iVar7 == 0) goto LAB_0011a687;
                  sVar15 = lVar17 + (ulong)((data->change).url[5] == '/') + 1;
                }
                else {
                  sVar15 = lVar17 + 3;
                }
              }
              pcVar14 = (char *)(*Curl_cmalloc)(sVar15 + sVar20 + 1);
              if (pcVar14 != (char *)0x0) {
                memcpy(pcVar14,(data->change).url,sVar15);
                memcpy(pcVar14 + sVar15,pbVar21,sVar20 + 1);
                if ((data->change).url_alloc == true) {
                  (*Curl_cfree)((data->change).url);
                  (data->change).url = (char *)0x0;
                  (data->change).url_alloc = false;
                }
                Curl_infof(data,"Rebuilt URL to: %s\n",pcVar14);
                (data->change).url = pcVar14;
                (data->change).url_alloc = true;
                pcVar14 = (char *)local_98;
                pbVar23 = pbVar21;
LAB_0011a648:
                local_98 = &pcVar12->host;
                pCVar25 = &Curl_handler_http;
                ppCVar27 = protocols;
LAB_0011a667:
                ppCVar27 = ppCVar27 + 1;
                iVar7 = Curl_strcasecompare(pCVar25->scheme,pcVar14);
                if (iVar7 == 0) goto code_r0x0011a676;
                if ((((uint)(data->set).allowed_protocols & pCVar25->protocol) != 0) &&
                   (((data->state).this_is_a_follow != true ||
                    (((uint)(data->set).redir_protocols & pCVar25->protocol) != 0)))) {
                  pcVar12->given = pCVar25;
                  pcVar12->handler = pCVar25;
                  CVar8 = parse_url_login(data,pcVar12,&local_80,&local_88,&local_90);
                  if (CVar8 != CURLE_OK) goto LAB_0011afeb;
                  pcVar14 = (pcVar12->host).name;
                  if ((*pcVar14 == '[') &&
                     (pbVar21 = (byte *)strchr(pcVar14,0x25), pbVar21 != (byte *)0x0)) {
                    iVar7 = *pbVar21 - 0x25;
                    if ((iVar7 == 0) && (iVar7 = pbVar21[1] - 0x32, iVar7 == 0)) {
                      iVar7 = 0x35 - (uint)pbVar21[2];
                    }
                    else {
                      iVar7 = -iVar7;
                    }
                    if (iVar7 == 0) {
                      lVar17 = 3;
                    }
                    else {
                      Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
                      lVar17 = 1;
                    }
                    uVar22 = strtoul((char *)(pbVar21 + lVar17),&local_58,10);
                    if (*local_58 == ']') {
                      sVar20 = strlen(local_58);
                      memmove(pbVar21,local_58,sVar20 + 1);
                      pcVar12->scope_id = (uint)uVar22;
                    }
                    else {
                      Curl_infof(data,"Invalid IPv6 address format\n");
                    }
                  }
                  uVar2 = (data->set).scope_id;
                  if (uVar2 != 0) {
                    pcVar12->scope_id = uVar2;
                  }
                  pcVar14 = strchr((char *)pbVar23,0x23);
                  if (pcVar14 != (char *)0x0) {
                    *pcVar14 = '\0';
                    pcVar14 = strchr((data->change).url,0x23);
                    if (pcVar14 != (char *)0x0) {
                      *pcVar14 = '\0';
                    }
                  }
                  if ((char)local_9c == '\0') goto LAB_0011a9da;
                  pbVar23 = (byte *)curl_maprintf("%s://%s",pcVar12->handler->scheme,
                                                  (data->change).url);
                  if (pbVar23 != (byte *)0x0) {
                    bVar5 = *pbVar23;
                    pbVar21 = pbVar23;
                    while (bVar5 != 0x3a) {
                      iVar7 = tolower((uint)bVar5);
                      *pbVar21 = (byte)iVar7;
                      bVar5 = pbVar21[1];
                      pbVar21 = pbVar21 + 1;
                    }
                    if ((data->change).url_alloc == true) {
                      (*Curl_cfree)((data->change).url);
                    }
                    (data->change).url = (char *)pbVar23;
                    (data->change).url_alloc = true;
LAB_0011a9da:
                    if (((pcVar12->given->flags & 0x40) != 0) &&
                       (pcVar14 = strchr((pcVar12->data->state).path,0x3f), pcVar14 != (char *)0x0))
                    {
                      *pcVar14 = '\0';
                    }
                    pcVar14 = (data->set).str[0x35];
                    if (pcVar14 == (char *)0x0) {
LAB_0011aa2d:
                      pcVar14 = (data->set).str[0x36];
                      if (pcVar14 != (char *)0x0) {
                        pcVar14 = (*Curl_cstrdup)(pcVar14);
                        pcVar12->unix_domain_socket = pcVar14;
                        if (pcVar14 == (char *)0x0) goto LAB_0011afe6;
                        pcVar12->abstract_unix_socket = (data->set).abstract_unix_socket;
                      }
                      CVar8 = create_conn_helper_init_proxy(pcVar12);
                      if (CVar8 != CURLE_OK) goto LAB_0011afeb;
                      if (((pcVar12->given->flags & 1) != 0) && ((pcVar12->bits).httpproxy == true))
                      {
                        (pcVar12->bits).tunnel_proxy = true;
                      }
                      CVar8 = parse_remote_port(data,pcVar12);
                      if (((((((CVar8 != CURLE_OK) ||
                              (CVar8 = override_login(data,pcVar12,&local_80,&local_88,&local_90),
                              CVar8 != CURLE_OK)) ||
                             (CVar8 = set_login(pcVar12,local_80,local_88,local_90),
                             CVar8 != CURLE_OK)) ||
                            ((CVar8 = parse_connect_to_slist(data,pcVar12,(data->set).connect_to),
                             CVar8 != CURLE_OK ||
                             (CVar8 = fix_hostname((connectdata *)pcVar12->data,local_98),
                             CVar8 != CURLE_OK)))) ||
                           (((pcVar12->bits).conn_to_host == true &&
                            (CVar8 = fix_hostname((connectdata *)pcVar12->data,
                                                  &pcVar12->conn_to_host), CVar8 != CURLE_OK)))) ||
                          (((pcVar12->bits).httpproxy == true &&
                           (CVar8 = fix_hostname((connectdata *)pcVar12->data,
                                                 &(pcVar12->http_proxy).host), CVar8 != CURLE_OK))))
                         || (((pcVar12->bits).socksproxy == true &&
                             (CVar8 = fix_hostname((connectdata *)pcVar12->data,
                                                   &(pcVar12->socks_proxy).host), CVar8 != CURLE_OK)
                             ))) goto LAB_0011afeb;
                      if (((pcVar12->bits).conn_to_host == true) &&
                         (iVar7 = Curl_strcasecompare((pcVar12->conn_to_host).name,
                                                      (pcVar12->host).name), iVar7 != 0)) {
                        (pcVar12->bits).conn_to_host = false;
                      }
                      cVar6 = (pcVar12->bits).conn_to_port;
                      if (((_Bool)cVar6 == true) && (pcVar12->conn_to_port == pcVar12->remote_port))
                      {
                        (pcVar12->bits).conn_to_port = false;
                        cVar6 = '\0';
                      }
                      if ((((pcVar12->bits).conn_to_host != false) || (cVar6 != '\0')) &&
                         ((pcVar12->bits).httpproxy == true)) {
                        (pcVar12->bits).tunnel_proxy = true;
                      }
                      CVar8 = setup_connection_internals(pcVar12);
                      if (CVar8 != CURLE_OK) goto LAB_0011afeb;
                      pcVar12->recv[0] = Curl_recv_plain;
                      pcVar12->send[0] = Curl_send_plain;
                      pcVar12->recv[1] = Curl_recv_plain;
                      pcVar12->send[1] = Curl_send_plain;
                      (pcVar12->bits).tcp_fastopen = (data->set).tcp_fastopen;
                      if ((pcVar12->handler->flags & 0x10) != 0) {
                        CVar9 = (*pcVar12->handler->connect_it)(pcVar12,local_48);
                        if (CVar9 == CURLE_OK) {
                          pcVar12->data = data;
                          (pcVar12->bits).tcpconnect[0] = true;
                          Curl_conncache_add_conn((data->state).conn_cache,pcVar12);
                          CVar8 = setup_range(data);
                          if (CVar8 != CURLE_OK) {
                            (*pcVar12->handler->done)(pcVar12,CVar8,false);
                            goto LAB_0011afeb;
                          }
                          Curl_setup_transfer(pcVar12,-1,-1,false,(curl_off_t *)0x0,-1,
                                              (curl_off_t *)0x0);
                        }
                        Curl_init_do(data,pcVar12);
                        CVar8 = CVar9;
                        goto LAB_0011afeb;
                      }
                      pcVar14 = (data->set).str[0x1b];
                      (data->set).ssl.primary.CApath = (data->set).str[0x1a];
                      (data->set).proxy_ssl.primary.CApath = pcVar14;
                      (data->set).ssl.primary.CAfile = (data->set).str[0x1c];
                      (data->set).proxy_ssl.primary.CAfile = (data->set).str[0x1d];
                      pcVar14 = (data->set).str[0x23];
                      (data->set).ssl.primary.random_file = pcVar14;
                      (data->set).proxy_ssl.primary.random_file = pcVar14;
                      pcVar14 = (data->set).str[0x22];
                      (data->set).ssl.primary.egdsocket = pcVar14;
                      (data->set).proxy_ssl.primary.egdsocket = pcVar14;
                      (data->set).ssl.primary.cipher_list = (data->set).str[0x20];
                      (data->set).proxy_ssl.primary.cipher_list = (data->set).str[0x21];
                      (data->set).ssl.CRLfile = (data->set).str[0x25];
                      (data->set).proxy_ssl.CRLfile = (data->set).str[0x26];
                      (data->set).ssl.issuercert = (data->set).str[0x27];
                      (data->set).proxy_ssl.issuercert = (data->set).str[0x28];
                      pcVar14 = (data->set).str[0];
                      pcVar16 = (data->set).str[1];
                      (data->set).ssl.cert = pcVar14;
                      (data->set).proxy_ssl.cert = pcVar16;
                      (data->set).ssl.cert_type = (data->set).str[2];
                      (data->set).proxy_ssl.cert_type = (data->set).str[3];
                      (data->set).ssl.key = (data->set).str[0xd];
                      (data->set).proxy_ssl.key = (data->set).str[0xe];
                      (data->set).ssl.key_type = (data->set).str[0x11];
                      (data->set).proxy_ssl.key_type = (data->set).str[0x12];
                      pcVar26 = (data->set).str[0x10];
                      (data->set).ssl.key_passwd = (data->set).str[0xf];
                      (data->set).proxy_ssl.key_passwd = pcVar26;
                      (data->set).ssl.primary.clientcert = pcVar14;
                      (data->set).proxy_ssl.primary.clientcert = pcVar16;
                      _Var4 = Curl_clone_primary_ssl_config
                                        (&(data->set).ssl.primary,&pcVar12->ssl_config);
                      if (!_Var4) goto LAB_0011afe6;
                      _Var4 = Curl_clone_primary_ssl_config
                                        (&(data->set).proxy_ssl.primary,&pcVar12->proxy_ssl_config);
                      CVar8 = CURLE_OUT_OF_MEMORY;
                      if (!_Var4) goto LAB_0011afeb;
                      prune_dead_connections(data);
                      if ((((data->set).reuse_fresh == true) &&
                          ((data->state).this_is_a_follow != true)) ||
                         (_Var4 = ConnectionExists(data,pcVar12,&local_60,&local_9d,&local_9e),
                         pcVar24 = local_60, !_Var4)) {
LAB_0011af6c:
                        if ((pcVar12->handler->flags & 0x100) != 0) {
                          if ((data->set).ssl_enable_alpn == true) {
                            (pcVar12->bits).tls_enable_alpn = true;
                          }
                          if ((data->set).ssl_enable_npn == true) {
                            (pcVar12->bits).tls_enable_npn = true;
                          }
                        }
                        if (local_9e != false) {
LAB_0011afad:
                          Curl_infof(data,"No connections available.\n");
                          conn_free(pcVar12);
                          *in_connect = (connectdata *)0x0;
                          CVar8 = CURLE_NO_CONNECTION_AVAILABLE;
                          goto LAB_0011afeb;
                        }
                        bundle = Curl_conncache_find_bundle(pcVar12,(data->state).conn_cache);
                        if ((bundle == (connectbundle *)0x0 || local_78 == 0) ||
                           (bundle->num_connections < local_78)) {
                          Curl_conncache_unlock(pcVar12);
                        }
                        else {
                          pcVar24 = Curl_conncache_extract_bundle(data,bundle);
                          Curl_conncache_unlock(pcVar12);
                          if (pcVar24 == (connectdata *)0x0) {
                            Curl_infof(data,"No more connections allowed to host: %d\n",local_78);
                            goto LAB_0011afad;
                          }
                          pcVar24->data = data;
                          Curl_disconnect(pcVar24,false);
                        }
                        if ((local_70 != 0) &&
                           (sVar10 = Curl_conncache_size(data), local_70 <= sVar10)) {
                          pcVar24 = Curl_conncache_extract_oldest(data);
                          if (pcVar24 == (connectdata *)0x0) {
                            Curl_infof(data,"No connections available in cache\n");
                            goto LAB_0011afad;
                          }
                          pcVar24->data = data;
                          Curl_disconnect(pcVar24,false);
                        }
                        pcVar12->inuse = true;
                        Curl_conncache_add_conn((data->state).conn_cache,pcVar12);
                        if ((((data->state).authhost.picked & 0x28) != 0) &&
                           ((data->state).authhost.done == true)) {
                          Curl_infof(data,"NTLM picked AND auth done set, clear picked!\n");
                          (data->state).authhost.picked = 0;
                          (data->state).authhost.done = false;
                        }
                        if ((((data->state).authproxy.picked & 0x28) != 0) &&
                           ((data->state).authproxy.done == true)) {
                          Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked!\n");
                          (data->state).authproxy.picked = 0;
                          (data->state).authproxy.done = false;
                        }
                      }
                      else {
                        if (((local_9d == false) &&
                            (iVar7 = IsPipeliningPossible(data,local_60), iVar7 != 0)) &&
                           ((pcVar24->recv_pipe).size + (pcVar24->send_pipe).size != 0)) {
                          Curl_infof(data,"Found connection %ld, with requests in the pipe (%zu)\n",
                                     pcVar24->connection_id);
                          sVar10 = Curl_conncache_bundle_size(pcVar24);
                          if ((sVar10 < local_78) &&
                             (sVar10 = Curl_conncache_size(data), sVar10 < local_70)) {
                            Curl_infof(data,"We can reuse, but we want a new connection anyway\n");
                            Curl_conncache_return_conn(pcVar24);
                            goto LAB_0011af6c;
                          }
                        }
                        reuse_conn(pcVar12,pcVar24);
                        (*Curl_cfree)(pcVar12->ssl_extra);
                        (*Curl_cfree)(pcVar12);
                        *in_connect = pcVar24;
                        pcVar14 = "host";
                        if ((pcVar24->bits).proxy != false) {
                          pcVar14 = "proxy";
                        }
                        lVar17 = 0x128;
                        if (((pcVar24->socks_proxy).host.name == (char *)0x0) &&
                           (lVar17 = 0x168, (pcVar24->http_proxy).host.name == (char *)0x0)) {
                          lVar17 = 0xe0;
                        }
                        Curl_infof(data,"Re-using existing connection! (#%ld) with %s %s\n",
                                   pcVar24->connection_id,pcVar14,
                                   *(undefined8 *)((pcVar24->chunk).hexbuffer + lVar17 + -0x20));
                        pcVar12 = pcVar24;
                      }
                      Curl_init_do(data,pcVar12);
                      CVar8 = setup_range(data);
                      if (CVar8 == CURLE_OK) {
                        pcVar12->seek_func = (data->set).seek_func;
                        pcVar12->seek_client = (data->set).seek_client;
                        CVar8 = resolve_server(data,pcVar12,local_68);
                      }
                      goto LAB_0011afeb;
                    }
                    pcVar14 = (*Curl_cstrdup)(pcVar14);
                    pcVar12->oauth_bearer = pcVar14;
                    if (pcVar14 != (char *)0x0) goto LAB_0011aa2d;
                  }
                  goto LAB_0011afe6;
                }
                goto LAB_0011a763;
              }
            }
            else {
              pcVar14 = "";
              if (1 < sVar20) {
                pcVar14 = "es";
              }
              Curl_infof(data,"Unwillingly accepted illegal URL using %d slash%s!\n",sVar20,pcVar14)
              ;
              if ((data->change).url_alloc == true) {
                (*Curl_cfree)((data->change).url);
              }
              pcVar14 = local_48;
              pcVar16 = curl_maprintf("%s://%s%s",pcVar14,(pcVar12->host).name,pbVar23);
              (data->change).url = pcVar16;
              if (pcVar16 != (char *)0x0) {
                (data->change).url_alloc = true;
                goto LAB_0011a36f;
              }
            }
            CVar8 = CURLE_OUT_OF_MEMORY;
            goto LAB_0011afeb;
          }
          pcVar14 = "Bad URL, colon is first character";
        }
        else {
          pcVar14 = "Illegal characters found in URL";
        }
LAB_0011a68e:
        Curl_failf(data,pcVar14);
        CVar8 = CURLE_URL_MALFORMAT;
        goto LAB_0011afeb;
      }
    }
  }
LAB_0011afe6:
  CVar8 = CURLE_OUT_OF_MEMORY;
LAB_0011afeb:
  (*Curl_cfree)(local_90);
  (*Curl_cfree)(local_88);
  (*Curl_cfree)(local_80);
  if (CVar8 == CURLE_OK) {
    pcVar12 = *in_connect;
    if (((pcVar12->send_pipe).size != 0) || ((pcVar12->recv_pipe).size != 0)) {
      *protocol_done = true;
      return CURLE_OK;
    }
    if (*local_68 != false) {
      return CURLE_OK;
    }
    CVar8 = Curl_setup_conn(pcVar12,protocol_done);
  }
  if (CVar8 != CURLE_OK) {
    if (CVar8 == CURLE_NO_CONNECTION_AVAILABLE) {
      *in_connect = (connectdata *)0x0;
      CVar8 = CURLE_NO_CONNECTION_AVAILABLE;
    }
    else if (*in_connect != (connectdata *)0x0) {
      Curl_disconnect(*in_connect,false);
      *in_connect = (connectdata *)0x0;
    }
  }
  return CVar8;
code_r0x0011a676:
  pCVar25 = *ppCVar27;
  if (pCVar25 == (Curl_handler *)0x0) goto LAB_0011a763;
  goto LAB_0011a667;
LAB_0011a763:
  Curl_failf(data,"Protocol \"%s\" not supported or disabled in libcurl",pcVar14);
  CVar8 = CURLE_UNSUPPORTED_PROTOCOL;
  goto LAB_0011afeb;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      struct connectdata **in_connect,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* call the stuff that needs to be called */
  result = create_conn(data, in_connect, asyncp);

  if(!result) {
    /* no error */
    if((*in_connect)->send_pipe.size || (*in_connect)->recv_pipe.size)
      /* pipelining */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(*in_connect, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    *in_connect = NULL;
    return result;
  }

  if(result && *in_connect) {
    /* We're not allowed to return failure with memory left allocated
       in the connectdata struct, free those here */
    Curl_disconnect(*in_connect, FALSE); /* close the connection */
    *in_connect = NULL;           /* return a NULL */
  }

  return result;
}